

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

void BrotliEncoderSetCustomDictionary(BrotliEncoderState *s,size_t size,uint8_t *dict)

{
  void *__s2;
  ushort uVar1;
  uint16_t uVar2;
  H10 *self;
  H54 *__s;
  H40 *m;
  H2 *__s_00;
  H4 *__s_01;
  H42 *m_00;
  H41 *m_01;
  H6 *__s_02;
  H3 *__s_03;
  H5 *__s_04;
  H9 *__s_05;
  H7 *__s_06;
  H8 *__s_07;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint32_t *puVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  void *__s1;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  H42 *self_00;
  ulong uVar19;
  uint32_t uVar20;
  size_t input_size;
  long lVar21;
  bool bVar22;
  int in_stack_ffffffffffffff78;
  ulong local_68;
  uint local_60;
  H42 *local_58;
  ulong local_50;
  
  iVar4 = (s->params).lgwin;
  EnsureInitialized(s);
  if (size == 0) {
    return;
  }
  if ((uint)(s->params).quality < 2) {
    return;
  }
  uVar11 = (1L << ((byte)iVar4 & 0x3f)) - 0x10;
  input_size = size;
  if (uVar11 < size) {
    input_size = uVar11;
  }
  lVar21 = 0;
  if (uVar11 <= size) {
    lVar21 = size - uVar11;
  }
  self_00 = (H42 *)(dict + lVar21);
  CopyInputToRingBuffer(s,input_size,(uint8_t *)self_00);
  s->last_flush_pos_ = input_size;
  s->last_processed_pos_ = input_size;
  if ((uVar11 != 0) &&
     (s->prev_byte_ = *(uint8_t *)((long)self_00->addr + (input_size - 1)), 1 < input_size)) {
    s->prev_byte2_ = *(uint8_t *)((long)self_00->addr + (input_size - 2));
  }
  uVar3 = (s->params).quality;
  if (9 < (int)uVar3) {
    self = (s->hashers_).h10;
    uVar11 = 0;
    InitH10(&s->memory_manager_,self,(uint8_t *)s,(BrotliEncoderParams *)0x0,input_size,0,
            in_stack_ffffffffffffff78);
    local_58 = self_00;
    do {
      if (input_size <= uVar11 + 0x7f) {
        return;
      }
      uVar7 = self->window_mask_;
      __s1 = (void *)((long)self_00->addr + uVar11);
      uVar3 = (uint)(*(int *)((long)self_00->addr + uVar11) * 0x1e35a7bd) >> 0xf;
      uVar20 = self->buckets_[uVar3];
      local_68 = (uVar7 & uVar11) * 2 + 1;
      uVar10 = (uVar7 & uVar11) * 2;
      self->buckets_[uVar3] = (uint32_t)uVar11;
      uVar18 = 0;
      local_50 = 0;
      lVar21 = 0x40;
      while( true ) {
        uVar12 = (ulong)uVar20;
        if (uVar11 == uVar12) break;
        bVar22 = lVar21 == 0;
        lVar21 = lVar21 + -1;
        if ((uVar7 - 0xf < uVar11 - uVar12) || (bVar22)) break;
        uVar5 = local_50;
        if (uVar18 < local_50) {
          uVar5 = uVar18;
        }
        if (0x80 < uVar5) {
          __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                        ,0x9d,
                        "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                       );
        }
        __s2 = (void *)((long)self_00->addr + uVar12);
        uVar19 = 0x80 - uVar5;
        uVar14 = uVar19 >> 3;
        uVar12 = (ulong)((uint)uVar19 & 0xf8);
        lVar17 = 0;
LAB_00127d42:
        bVar22 = uVar14 == 0;
        uVar14 = uVar14 - 1;
        if (bVar22) {
          uVar15 = (ulong)((uint)uVar19 & 7);
          pcVar9 = (char *)((long)__s2 + lVar17 + uVar5);
          for (; (bVar22 = uVar15 != 0, uVar15 = uVar15 - 1, uVar14 = uVar19, bVar22 &&
                 (uVar14 = uVar12, *(char *)((long)local_58->addr + uVar12 + uVar5) == *pcVar9));
              uVar12 = uVar12 + 1) {
            pcVar9 = pcVar9 + 1;
          }
        }
        else {
          uVar15 = *(ulong *)((long)__s2 + lVar17 + uVar5);
          uVar16 = *(ulong *)((long)local_58->addr + lVar17 + uVar5);
          if (uVar15 == uVar16) goto code_r0x00127d59;
          uVar16 = uVar16 ^ uVar15;
          uVar12 = 0;
          if (uVar16 != 0) {
            for (; (uVar16 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
            }
          }
          uVar14 = (uVar12 >> 3 & 0x1fffffff) + lVar17;
        }
        uVar14 = uVar14 + uVar5;
        iVar4 = bcmp(__s1,__s2,uVar14);
        if (iVar4 != 0) {
          __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                        ,0xa2,
                        "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                       );
        }
        local_60 = (uint)uVar7;
        if (0x7f < uVar14) {
          puVar6 = self->forest_;
          puVar6[uVar10] = puVar6[(ulong)(local_60 & uVar20) * 2];
          uVar20 = puVar6[(ulong)(local_60 & uVar20) * 2 + 1];
          goto LAB_00127e71;
        }
        uVar12 = (ulong)(uVar20 & local_60) * 2;
        puVar6 = self->forest_;
        if (*(byte *)((long)__s2 + uVar14) < *(byte *)((long)__s1 + uVar14)) {
          puVar6[uVar10] = uVar20;
          uVar12 = uVar12 | 1;
          uVar18 = uVar14;
          uVar10 = uVar12;
        }
        else {
          puVar6[local_68] = uVar20;
          local_68 = uVar12;
          local_50 = uVar14;
        }
        uVar20 = puVar6[uVar12];
      }
      uVar20 = self->invalid_pos_;
      puVar6 = self->forest_;
      puVar6[uVar10] = uVar20;
LAB_00127e71:
      puVar6[local_68] = uVar20;
      uVar11 = uVar11 + 1;
      local_58 = (H42 *)((long)local_58->addr + 1);
    } while( true );
  }
  if (uVar3 == 4) {
    if (0xfffff < (s->params).size_hint) {
      __s = (s->hashers_).h54;
      if (__s->is_dirty_ != 0) {
        memset(__s,0,0x400014);
      }
      for (uVar11 = 0; uVar11 + 7 < input_size; uVar11 = uVar11 + 1) {
        __s->buckets_
        [(uint)((ulong)(*(long *)((long)self_00->addr + uVar11) * 0x35a7bd1e35a7bd00) >> 0x2c) +
         ((uint)(uVar11 >> 3) & 3)] = (uint32_t)uVar11;
      }
      return;
    }
switchD_00127fd6_caseD_4:
    __s_01 = (s->hashers_).h4;
    if (__s_01->is_dirty_ != 0) {
      memset(__s_01,0,0x80014);
    }
    for (uVar11 = 0; uVar11 + 7 < input_size; uVar11 = uVar11 + 1) {
      __s_01->buckets_
      [(uint)((ulong)(*(long *)((long)self_00->addr + uVar11) * -0x42e1ca5843000000) >> 0x2f) +
       ((uint)(uVar11 >> 3) & 3)] = (uint32_t)uVar11;
    }
  }
  else {
    uVar8 = uVar3;
    if (((4 < (int)uVar3) && ((s->params).lgwin < 0x11)) && (uVar8 = 0x2a - (uVar3 < 9), uVar3 < 7))
    {
      m = (s->hashers_).h40;
      InitH40((MemoryManager *)m,(H40 *)self_00,(uint8_t *)s,(BrotliEncoderParams *)0x0,input_size,0
              ,in_stack_ffffffffffffff78);
      for (uVar11 = 0; uVar11 + 3 < input_size; uVar11 = uVar11 + 1) {
        uVar3 = (uint)(*(int *)((long)self_00->addr + uVar11) * 0x1e35a7bd) >> 0x11;
        uVar7 = (ulong)uVar3;
        uVar1 = m->free_slot_idx[0];
        m->free_slot_idx[0] = uVar1 + 1;
        uVar10 = uVar11 - *(uint *)((long)m->addr + uVar7 * 4);
        m->tiny_hash[uVar11 & 0xffff] = (uint8_t)uVar3;
        if (0xfffe < uVar10) {
          uVar10 = 0xffff;
        }
        m->banks[0].slots[uVar1].delta = (uint16_t)uVar10;
        m->banks[0].slots[uVar1].next = m->head[uVar7];
        *(int *)((long)m->addr + uVar7 * 4) = (int)uVar11;
        m->head[uVar7] = uVar1;
      }
      return;
    }
    switch(uVar8) {
    case 2:
      __s_00 = (s->hashers_).h2;
      if (__s_00->is_dirty_ != 0) {
        memset(__s_00,0,0x40008);
      }
      for (lVar21 = 0; lVar21 + 7U < input_size; lVar21 = lVar21 + 1) {
        __s_00->buckets_
        [(ulong)(*(long *)((long)self_00->addr + lVar21) * -0x42e1ca5843000000) >> 0x30] =
             (uint32_t)lVar21;
      }
      break;
    case 3:
      __s_03 = (s->hashers_).h3;
      if (__s_03->is_dirty_ != 0) {
        memset(__s_03,0,0x4000c);
      }
      for (lVar21 = 0; lVar21 + 7U < input_size; lVar21 = lVar21 + 1) {
        *(uint *)((long)__s_03->buckets_ +
                 (ulong)(((uint)(ushort)((ulong)(*(long *)((long)self_00->addr + lVar21) *
                                                -0x42e1ca5843000000) >> 0x30) +
                         (uint)(((uint)lVar21 >> 3 & 1) != 0)) * 4)) = (uint)lVar21;
      }
      break;
    case 4:
      goto switchD_00127fd6_caseD_4;
    case 5:
      __s_04 = (s->hashers_).h5;
      if (__s_04->is_dirty_ != 0) {
        memset(__s_04,0,0x8000);
        __s_04->is_dirty_ = 0;
      }
      for (lVar21 = 0; lVar21 + 3U < input_size; lVar21 = lVar21 + 1) {
        uVar3 = (uint)(*(int *)((long)self_00->addr + lVar21) * 0x1e35a7bd) >> 0x12;
        uVar1 = __s_04->num_[uVar3];
        *(int *)((long)__s_04->buckets_ + (ulong)(uVar3 * 0x40 + (uVar1 & 0xf) * 4)) = (int)lVar21;
        __s_04->num_[uVar3] = uVar1 + 1;
      }
      break;
    case 6:
      __s_02 = (s->hashers_).h6;
      if (__s_02->is_dirty_ != 0) {
        memset(__s_02,0,0x8000);
        __s_02->is_dirty_ = 0;
      }
      for (lVar21 = 0; lVar21 + 3U < input_size; lVar21 = lVar21 + 1) {
        uVar3 = (uint)(*(int *)((long)self_00->addr + lVar21) * 0x1e35a7bd) >> 0x12;
        uVar1 = __s_02->num_[uVar3];
        *(int *)((long)__s_02->buckets_ + (ulong)(uVar3 * 0x80 + (uVar1 & 0x1f) * 4)) = (int)lVar21;
        __s_02->num_[uVar3] = uVar1 + 1;
      }
      break;
    case 7:
      __s_06 = (s->hashers_).h7;
      if (__s_06->is_dirty_ != 0) {
        memset(__s_06,0,0x10000);
        __s_06->is_dirty_ = 0;
      }
      for (lVar21 = 0; lVar21 + 3U < input_size; lVar21 = lVar21 + 1) {
        uVar3 = (uint)(*(int *)((long)self_00->addr + lVar21) * 0x1e35a7bd) >> 0x11;
        uVar1 = __s_06->num_[uVar3];
        *(int *)((long)__s_06->buckets_ + (ulong)(uVar3 * 0x100 + (uVar1 & 0x3f) * 4)) = (int)lVar21
        ;
        __s_06->num_[uVar3] = uVar1 + 1;
      }
      break;
    case 8:
      __s_07 = (s->hashers_).h8;
      if (__s_07->is_dirty_ != 0) {
        memset(__s_07,0,0x10000);
        __s_07->is_dirty_ = 0;
      }
      for (lVar21 = 0; lVar21 + 3U < input_size; lVar21 = lVar21 + 1) {
        uVar3 = (uint)(*(int *)((long)self_00->addr + lVar21) * 0x1e35a7bd) >> 0x11;
        uVar1 = __s_07->num_[uVar3];
        *(int *)((long)__s_07->buckets_ + (ulong)(uVar3 * 0x200 + (uVar1 & 0x7f) * 4)) = (int)lVar21
        ;
        __s_07->num_[uVar3] = uVar1 + 1;
      }
      break;
    case 9:
      __s_05 = (s->hashers_).h9;
      if (__s_05->is_dirty_ != 0) {
        memset(__s_05,0,0x10000);
        __s_05->is_dirty_ = 0;
      }
      for (lVar21 = 0; lVar21 + 3U < input_size; lVar21 = lVar21 + 1) {
        uVar3 = (uint)(*(int *)((long)self_00->addr + lVar21) * 0x1e35a7bd) >> 0x11;
        uVar2 = __s_05->num_[uVar3];
        *(int *)((long)__s_05->buckets_ + (ulong)(uVar3 * 0x400 + (uint)(byte)uVar2 * 4)) =
             (int)lVar21;
        __s_05->num_[uVar3] = uVar2 + 1;
      }
      break;
    default:
      if (uVar8 == 0x29) {
        m_01 = (s->hashers_).h41;
        InitH41((MemoryManager *)m_01,(H41 *)self_00,(uint8_t *)s,(BrotliEncoderParams *)0x0,
                input_size,0,in_stack_ffffffffffffff78);
        for (uVar11 = 0; uVar11 + 3 < input_size; uVar11 = uVar11 + 1) {
          uVar3 = (uint)(*(int *)((long)self_00->addr + uVar11) * 0x1e35a7bd) >> 0x11;
          uVar7 = (ulong)uVar3;
          uVar1 = m_01->free_slot_idx[0];
          m_01->free_slot_idx[0] = uVar1 + 1;
          uVar10 = uVar11 - *(uint *)((long)m_01->addr + uVar7 * 4);
          m_01->tiny_hash[uVar11 & 0xffff] = (uint8_t)uVar3;
          if (0xfffe < uVar10) {
            uVar10 = 0xffff;
          }
          m_01->banks[0].slots[uVar1].delta = (uint16_t)uVar10;
          m_01->banks[0].slots[uVar1].next = m_01->head[uVar7];
          *(int *)((long)m_01->addr + uVar7 * 4) = (int)uVar11;
          m_01->head[uVar7] = uVar1;
        }
      }
      else if (uVar8 == 0x2a) {
        m_00 = (s->hashers_).h42;
        InitH42((MemoryManager *)m_00,self_00,(uint8_t *)s,(BrotliEncoderParams *)0x0,input_size,0,
                in_stack_ffffffffffffff78);
        for (uVar11 = 0; uVar11 + 3 < input_size; uVar11 = uVar11 + 1) {
          uVar3 = (uint)(*(int *)((long)self_00->addr + uVar11) * 0x1e35a7bd) >> 0x11;
          uVar7 = (ulong)uVar3;
          uVar13 = uVar3 & 0x1ff;
          uVar1 = m_00->free_slot_idx[uVar13];
          m_00->free_slot_idx[uVar13] = uVar1 + 1;
          uVar8 = uVar1 & 0x1ff;
          uVar10 = uVar11 - *(uint *)((long)m_00->addr + uVar7 * 4);
          m_00->tiny_hash[uVar11 & 0xffff] = (uint8_t)uVar3;
          if (0xfffe < uVar10) {
            uVar10 = 0xffff;
          }
          *(short *)((long)&m_00->banks[0].slots[uVar8].delta + (ulong)(uVar13 << 0xb)) =
               (short)uVar10;
          *(uint16_t *)((long)&m_00->banks[0].slots[uVar8].next + (ulong)(uVar13 << 0xb)) =
               m_00->head[uVar7];
          *(int *)((long)m_00->addr + uVar7 * 4) = (int)uVar11;
          m_00->head[uVar7] = (uint16_t)uVar8;
        }
      }
    }
  }
  return;
code_r0x00127d59:
  lVar17 = lVar17 + 8;
  goto LAB_00127d42;
}

Assistant:

void BrotliEncoderSetCustomDictionary(BrotliEncoderState* s, size_t size,
                                      const uint8_t* dict) {
  size_t max_dict_size = BROTLI_MAX_BACKWARD_LIMIT(s->params.lgwin);
  size_t dict_size = size;
  MemoryManager* m = &s->memory_manager_;

  if (!EnsureInitialized(s)) return;

  if (dict_size == 0 ||
      s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return;
  }
  if (size > max_dict_size) {
    dict += size - max_dict_size;
    dict_size = max_dict_size;
  }
  CopyInputToRingBuffer(s, dict_size, dict);
  s->last_flush_pos_ = dict_size;
  s->last_processed_pos_ = dict_size;
  if (dict_size > 0) {
    s->prev_byte_ = dict[dict_size - 1];
  }
  if (dict_size > 1) {
    s->prev_byte2_ = dict[dict_size - 2];
  }
  HashersPrependCustomDictionary(m, &s->hashers_, &s->params, dict_size, dict);
  if (BROTLI_IS_OOM(m)) return;
}